

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O0

string * __thiscall OpenMD::ReplicateVisitor::toString_abi_cxx11_(ReplicateVisitor *this)

{
  undefined8 uVar1;
  uint *puVar2;
  long in_RSI;
  string *in_RDI;
  char buffer [65535];
  string *result;
  char acStack_10018 [65560];
  
  std::__cxx11::string::string((string *)in_RDI);
  snprintf(acStack_10018,0xffff,"--------------------------------------------------------------\n");
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  uVar1 = std::__cxx11::string::c_str();
  snprintf(acStack_10018,0xffff,"Visitor name: %s\n",uVar1);
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  snprintf(acStack_10018,0xffff,"Visitor Description: replicate the atoms in different direction\n")
  ;
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  puVar2 = (uint *)Vector<int,_3U>::operator[]((Vector<int,_3U> *)(in_RSI + 0x48),0);
  snprintf(acStack_10018,0xffff,"repeatX = %d:\n",(ulong)*puVar2);
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  puVar2 = (uint *)Vector<int,_3U>::operator[]((Vector<int,_3U> *)(in_RSI + 0x48),1);
  snprintf(acStack_10018,0xffff,"repeatY = %d:\n",(ulong)*puVar2);
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  puVar2 = (uint *)Vector<int,_3U>::operator[]((Vector<int,_3U> *)(in_RSI + 0x48),2);
  snprintf(acStack_10018,0xffff,"repeatZ = %d:\n",(ulong)*puVar2);
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  snprintf(acStack_10018,0xffff,"--------------------------------------------------------------\n");
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  return in_RDI;
}

Assistant:

const std::string ReplicateVisitor::toString() {
    char buffer[65535];
    std::string result;

    snprintf(
        buffer, 65535,
        "--------------------------------------------------------------\n");
    result += buffer;

    snprintf(buffer, 65535, "Visitor name: %s\n", visitorName.c_str());
    result += buffer;

    snprintf(
        buffer, 65535,
        "Visitor Description: replicate the atoms in different direction\n");
    result += buffer;

    // print the replicate direction
    snprintf(buffer, 65535, "repeatX = %d:\n", replicateOpt[0]);
    result += buffer;

    snprintf(buffer, 65535, "repeatY = %d:\n", replicateOpt[1]);
    result += buffer;

    snprintf(buffer, 65535, "repeatZ = %d:\n", replicateOpt[2]);
    result += buffer;

    snprintf(
        buffer, 65535,
        "--------------------------------------------------------------\n");
    result += buffer;

    return result;
  }